

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

Type * __thiscall soul::heart::StructElement::getType(StructElement *this)

{
  int iVar1;
  undefined4 extraout_var;
  Structure *this_00;
  Member *pMVar2;
  string_view memberName;
  
  iVar1 = (*(((this->parent).object)->super_Object)._vptr_Object[2])();
  this_00 = Type::getStructRef((Type *)CONCAT44(extraout_var,iVar1));
  memberName._M_str = (this->memberName)._M_dataplus._M_p;
  memberName._M_len = (this->memberName)._M_string_length;
  pMVar2 = Structure::getMemberWithName(this_00,memberName);
  return &pMVar2->type;
}

Assistant:

const Type& getType() const override            { return getStruct().getMemberWithName (memberName).type; }